

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O3

int agent_transact_unix(LIBSSH2_AGENT *agent,agent_transaction_ctx_t transctx)

{
  libssh2_socket_t lVar1;
  _func_ssize_t_libssh2_socket_t_void_ptr_size_t_int_void_ptr_ptr *p_Var2;
  uint32_t uVar3;
  int iVar4;
  uchar *puVar5;
  ulong uVar6;
  size_t sVar7;
  char *errmsg;
  LIBSSH2_SESSION *pLVar8;
  ulong uVar9;
  ulong uVar10;
  uchar buf [4];
  uchar local_44 [4];
  agent_transaction_ctx_t local_40;
  LIBSSH2_AGENT *local_38;
  
  switch(transctx->state) {
  case agent_NB_state_request_created:
    _libssh2_htonu32(local_44,(uint32_t)transctx->request_len);
    pLVar8 = agent->session;
    p_Var2 = pLVar8->send;
    lVar1 = agent->fd;
    uVar9 = 0;
    do {
      uVar10 = uVar9;
      if (3 < uVar9) break;
      uVar10 = (*p_Var2)(lVar1,local_44 + uVar9,4 - uVar9,0,&pLVar8->abstract);
      uVar9 = uVar9 + uVar10;
    } while (-1 < (long)uVar10);
    if ((int)uVar10 == -0xb) {
      return -0x25;
    }
    if (-1 < (int)uVar10) {
      transctx->state = agent_NB_state_request_length_sent;
      goto switchD_0010842a_caseD_2;
    }
    break;
  case agent_NB_state_request_length_sent:
switchD_0010842a_caseD_2:
    pLVar8 = agent->session;
    p_Var2 = pLVar8->send;
    lVar1 = agent->fd;
    puVar5 = transctx->request;
    uVar9 = transctx->request_len;
    uVar10 = 0;
    local_40 = transctx;
    local_38 = agent;
    do {
      sVar7 = uVar9 - uVar10;
      uVar6 = uVar10;
      if (uVar9 < uVar10 || sVar7 == 0) break;
      uVar6 = (*p_Var2)(lVar1,puVar5 + uVar10,sVar7,0,&pLVar8->abstract);
      uVar10 = uVar10 + uVar6;
    } while (-1 < (long)uVar6);
    if ((int)uVar6 == -0xb) {
      return -0x25;
    }
    agent = local_38;
    if (-1 < (int)uVar6) {
      local_40->state = agent_NB_state_request_sent;
      transctx = local_40;
      goto switchD_0010842a_caseD_3;
    }
    break;
  case agent_NB_state_request_sent:
switchD_0010842a_caseD_3:
    pLVar8 = agent->session;
    p_Var2 = pLVar8->recv;
    lVar1 = agent->fd;
    uVar9 = 0;
    do {
      uVar10 = uVar9;
      if (3 < uVar9) break;
      uVar10 = (*p_Var2)(lVar1,local_44 + uVar9,4 - uVar9,0,&pLVar8->abstract);
      uVar9 = uVar9 + uVar10;
    } while (-1 < (long)uVar10);
    if ((int)uVar10 < 0) {
      if ((int)uVar10 == -0xb) {
        return -0x25;
      }
      pLVar8 = agent->session;
      errmsg = "agent recv failed";
      iVar4 = -0x2b;
      goto LAB_00108611;
    }
    uVar3 = _libssh2_ntohu32(local_44);
    transctx->response_len = (ulong)uVar3;
    puVar5 = (uchar *)(*agent->session->alloc)((ulong)uVar3,&agent->session->abstract);
    transctx->response = puVar5;
    if (puVar5 == (uchar *)0x0) {
      return -6;
    }
    transctx->state = agent_NB_state_response_length_received;
    goto LAB_00108572;
  case agent_NB_state_response_length_received:
    puVar5 = transctx->response;
LAB_00108572:
    pLVar8 = agent->session;
    p_Var2 = pLVar8->recv;
    lVar1 = agent->fd;
    uVar9 = transctx->response_len;
    uVar10 = 0;
    local_40 = transctx;
    local_38 = agent;
    do {
      sVar7 = uVar9 - uVar10;
      uVar6 = uVar10;
      if (uVar9 < uVar10 || sVar7 == 0) break;
      uVar6 = (*p_Var2)(lVar1,puVar5 + uVar10,sVar7,0,&pLVar8->abstract);
      uVar10 = uVar10 + uVar6;
    } while (-1 < (long)uVar6);
    if (-1 < (int)uVar6) {
      local_40->state = agent_NB_state_response_received;
      return 0;
    }
    if ((int)uVar6 == -0xb) {
      return -0x25;
    }
    pLVar8 = local_38->session;
    errmsg = "agent recv failed";
    goto LAB_0010860c;
  default:
    return 0;
  }
  pLVar8 = agent->session;
  errmsg = "agent send failed";
LAB_0010860c:
  iVar4 = -7;
LAB_00108611:
  iVar4 = _libssh2_error(pLVar8,iVar4,errmsg);
  return iVar4;
}

Assistant:

static int
agent_transact_unix(LIBSSH2_AGENT *agent, agent_transaction_ctx_t transctx)
{
    unsigned char buf[4];
    int rc;

    /* Send the length of the request */
    if(transctx->state == agent_NB_state_request_created) {
        _libssh2_htonu32(buf, (uint32_t)transctx->request_len);
        rc = (int)_send_all(agent->session->send, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_length_sent;
    }

    /* Send the request body */
    if(transctx->state == agent_NB_state_request_length_sent) {
        rc = (int)_send_all(agent->session->send, agent->fd,
                            transctx->request, transctx->request_len, 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_sent;
    }

    /* Receive the length of a response */
    if(transctx->state == agent_NB_state_request_sent) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_RECV,
                                  "agent recv failed");
        }
        transctx->response_len = _libssh2_ntohu32(buf);
        transctx->response = LIBSSH2_ALLOC(agent->session,
                                           transctx->response_len);
        if(!transctx->response)
            return LIBSSH2_ERROR_ALLOC;

        transctx->state = agent_NB_state_response_length_received;
    }

    /* Receive the response body */
    if(transctx->state == agent_NB_state_response_length_received) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            transctx->response, transctx->response_len, 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent recv failed");
        }
        transctx->state = agent_NB_state_response_received;
    }

    return 0;
}